

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

bool __thiscall
cmLocalGenerator::GetRealDependency
          (cmLocalGenerator *this,string *inName,string *config,string *dep)

{
  bool bVar1;
  TargetType TVar2;
  ulong uVar3;
  char *pcVar4;
  string *psVar5;
  cmStateDirectory local_1a0;
  cmSourceFile *local_178;
  cmSourceFile *sf;
  string local_150;
  undefined1 local_130 [8];
  string depLocation;
  string local_f0;
  undefined1 local_d0 [8];
  string tLocation;
  cmGeneratorTarget *target;
  string local_78;
  uint local_54;
  undefined1 local_50 [8];
  string name;
  string *dep_local;
  string *config_local;
  string *inName_local;
  cmLocalGenerator *this_local;
  
  name.field_2._8_8_ = dep;
  cmsys::SystemTools::GetFilenameName((string *)local_50,inName);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    this_local._7_1_ = 0;
    local_54 = 1;
    goto LAB_004b5c1d;
  }
  cmsys::SystemTools::GetFilenameLastExtension(&local_78,(string *)local_50);
  bVar1 = std::operator==(&local_78,".exe");
  std::__cxx11::string::~string((string *)&local_78);
  if (bVar1) {
    cmsys::SystemTools::GetFilenameWithoutLastExtension((string *)&target,(string *)local_50);
    std::__cxx11::string::operator=((string *)local_50,(string *)&target);
    std::__cxx11::string::~string((string *)&target);
  }
  tLocation.field_2._8_8_ = FindGeneratorTargetToUse(this,(string *)local_50);
  if ((cmGeneratorTarget *)tLocation.field_2._8_8_ == (cmGeneratorTarget *)0x0) {
switchD_004b5a97_default:
    bVar1 = cmsys::SystemTools::FileIsFullPath(inName);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)name.field_2._8_8_,(string *)inName);
      this_local._7_1_ = 1;
      local_54 = 1;
    }
    else {
      local_178 = cmMakefile::GetSource(this->Makefile,inName,Ambiguous);
      if (local_178 == (cmSourceFile *)0x0) {
        cmStateSnapshot::GetDirectory(&local_1a0,&this->StateSnapshot);
        psVar5 = cmStateDirectory::GetCurrentSource_abi_cxx11_(&local_1a0);
        std::__cxx11::string::operator=((string *)name.field_2._8_8_,(string *)psVar5);
        std::__cxx11::string::operator+=((string *)name.field_2._8_8_,"/");
        std::__cxx11::string::operator+=((string *)name.field_2._8_8_,(string *)inName);
        this_local._7_1_ = 1;
        local_54 = 1;
      }
      else {
        psVar5 = cmSourceFile::GetFullPath(local_178,(string *)0x0);
        std::__cxx11::string::operator=((string *)name.field_2._8_8_,(string *)psVar5);
        this_local._7_1_ = 1;
        local_54 = 1;
      }
    }
  }
  else {
    bVar1 = cmsys::SystemTools::FileIsFullPath(inName);
    if (bVar1) {
      std::__cxx11::string::string((string *)local_d0);
      TVar2 = cmGeneratorTarget::GetType((cmGeneratorTarget *)tLocation.field_2._8_8_);
      if ((-1 < (int)TVar2) &&
         (TVar2 = cmGeneratorTarget::GetType((cmGeneratorTarget *)tLocation.field_2._8_8_),
         (int)TVar2 < 4)) {
        pcVar4 = cmGeneratorTarget::GetLocation((cmGeneratorTarget *)tLocation.field_2._8_8_,config)
        ;
        std::__cxx11::string::operator=((string *)local_d0,pcVar4);
        cmsys::SystemTools::GetFilenamePath(&local_f0,(string *)local_d0);
        std::__cxx11::string::operator=((string *)local_d0,(string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        cmsys::SystemTools::CollapseFullPath
                  ((string *)((long)&depLocation.field_2 + 8),(string *)local_d0);
        std::__cxx11::string::operator=
                  ((string *)local_d0,(string *)(depLocation.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(depLocation.field_2._M_local_buf + 8));
      }
      std::__cxx11::string::string((string *)&local_150,(string *)inName);
      cmsys::SystemTools::GetFilenamePath((string *)local_130,&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      cmsys::SystemTools::CollapseFullPath((string *)&sf,(string *)local_130);
      std::__cxx11::string::operator=((string *)local_130,(string *)&sf);
      std::__cxx11::string::~string((string *)&sf);
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_130,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_d0);
      if (bVar1) {
        std::__cxx11::string::operator=((string *)name.field_2._8_8_,(string *)inName);
        this_local._7_1_ = 1;
      }
      local_54 = (uint)bVar1;
      std::__cxx11::string::~string((string *)local_130);
      std::__cxx11::string::~string((string *)local_d0);
      if (local_54 != 0) goto LAB_004b5c1d;
    }
    TVar2 = cmGeneratorTarget::GetType((cmGeneratorTarget *)tLocation.field_2._8_8_);
    switch(TVar2) {
    case EXECUTABLE:
    case STATIC_LIBRARY:
    case SHARED_LIBRARY:
    case MODULE_LIBRARY:
    case UNKNOWN_LIBRARY:
      pcVar4 = cmGeneratorTarget::GetLocation((cmGeneratorTarget *)tLocation.field_2._8_8_,config);
      std::__cxx11::string::operator=((string *)name.field_2._8_8_,pcVar4);
      this_local._7_1_ = 1;
      local_54 = 1;
      break;
    case OBJECT_LIBRARY:
      this_local._7_1_ = 0;
      local_54 = 1;
      break;
    case UTILITY:
    case GLOBAL_TARGET:
      this_local._7_1_ = 0;
      local_54 = 1;
      break;
    case INTERFACE_LIBRARY:
      this_local._7_1_ = 0;
      local_54 = 1;
      break;
    default:
      goto switchD_004b5a97_default;
    }
  }
LAB_004b5c1d:
  std::__cxx11::string::~string((string *)local_50);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmLocalGenerator::GetRealDependency(const std::string& inName,
                                         const std::string& config,
                                         std::string& dep)
{
  // Older CMake code may specify the dependency using the target
  // output file rather than the target name.  Such code would have
  // been written before there was support for target properties that
  // modify the name so stripping down to just the file name should
  // produce the target name in this case.
  std::string name = cmSystemTools::GetFilenameName(inName);

  // If the input name is the empty string, there is no real
  // dependency. Short-circuit the other checks:
  if (name.empty()) {
    return false;
  }

  if (cmSystemTools::GetFilenameLastExtension(name) == ".exe") {
    name = cmSystemTools::GetFilenameWithoutLastExtension(name);
  }

  // Look for a CMake target with the given name.
  if (cmGeneratorTarget* target = this->FindGeneratorTargetToUse(name)) {
    // make sure it is not just a coincidence that the target name
    // found is part of the inName
    if (cmSystemTools::FileIsFullPath(inName)) {
      std::string tLocation;
      if (target->GetType() >= cmStateEnums::EXECUTABLE &&
          target->GetType() <= cmStateEnums::MODULE_LIBRARY) {
        tLocation = target->GetLocation(config);
        tLocation = cmSystemTools::GetFilenamePath(tLocation);
        tLocation = cmSystemTools::CollapseFullPath(tLocation);
      }
      std::string depLocation =
        cmSystemTools::GetFilenamePath(std::string(inName));
      depLocation = cmSystemTools::CollapseFullPath(depLocation);
      if (depLocation != tLocation) {
        // it is a full path to a depend that has the same name
        // as a target but is in a different location so do not use
        // the target as the depend
        dep = inName;
        return true;
      }
    }
    switch (target->GetType()) {
      case cmStateEnums::EXECUTABLE:
      case cmStateEnums::STATIC_LIBRARY:
      case cmStateEnums::SHARED_LIBRARY:
      case cmStateEnums::MODULE_LIBRARY:
      case cmStateEnums::UNKNOWN_LIBRARY:
        dep = target->GetLocation(config);
        return true;
      case cmStateEnums::OBJECT_LIBRARY:
        // An object library has no single file on which to depend.
        // This was listed to get the target-level dependency.
        return false;
      case cmStateEnums::INTERFACE_LIBRARY:
        // An interface library has no file on which to depend.
        // This was listed to get the target-level dependency.
        return false;
      case cmStateEnums::UTILITY:
      case cmStateEnums::GLOBAL_TARGET:
        // A utility target has no file on which to depend.  This was listed
        // only to get the target-level dependency.
        return false;
    }
  }

  // The name was not that of a CMake target.  It must name a file.
  if (cmSystemTools::FileIsFullPath(inName)) {
    // This is a full path.  Return it as given.
    dep = inName;
    return true;
  }

  // Check for a source file in this directory that matches the
  // dependency.
  if (cmSourceFile* sf = this->Makefile->GetSource(inName)) {
    dep = sf->GetFullPath();
    return true;
  }

  // Treat the name as relative to the source directory in which it
  // was given.
  dep = this->StateSnapshot.GetDirectory().GetCurrentSource();
  dep += "/";
  dep += inName;
  return true;
}